

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_EnumReservedMixNameAndNumber_Test::
ParseErrorTest_EnumReservedMixNameAndNumber_Test
          (ParseErrorTest_EnumReservedMixNameAndNumber_Test *this)

{
  ParseErrorTest_EnumReservedMixNameAndNumber_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseErrorTest);
  (this->super_ParseErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseErrorTest_EnumReservedMixNameAndNumber_Test_02a0d928;
  return;
}

Assistant:

TEST_F(ParseErrorTest, EnumReservedMixNameAndNumber) {
  ExpectHasErrors(
      "enum TestEnum {\n"
      "  FOO = 1;\n"
      "  reserved 10, \"foo\";\n"
      "}\n",
      "2:15: Expected enum number range.\n");
}